

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void generate_psnr_packet(AV1_COMP *cpi)

{
  uint uVar1;
  uint uVar2;
  long in_RDI;
  uint32_t bit_depth;
  uint32_t in_bit_depth;
  PSNR_STATS psnr;
  int i;
  aom_codec_cx_pkt pkt;
  aom_codec_pkt_list *in_stack_fffffffffffffe98;
  undefined8 local_158 [4];
  undefined8 auStack_138 [4];
  undefined4 auStack_118 [4];
  undefined8 auStack_108 [4];
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  PSNR_STATS *in_stack_ffffffffffffff20;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff28;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff30;
  undefined8 auStack_c8 [2];
  int local_b4;
  undefined4 local_b0;
  undefined4 auStack_a8 [4];
  undefined8 auStack_98 [4];
  undefined8 auStack_78 [4];
  undefined4 auStack_58 [4];
  undefined8 auStack_48 [4];
  undefined8 auStack_28 [4];
  long local_8;
  
  uVar1 = *(uint *)(in_RDI + 0x42328);
  uVar2 = *(uint *)(in_RDI + 0x17b70);
  local_8 = in_RDI;
  aom_calc_highbd_psnr
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
    auStack_a8[local_b4] = auStack_118[local_b4];
    auStack_98[local_b4] = auStack_138[local_b4];
    auStack_78[local_b4] = local_158[local_b4];
  }
  if (((*(uint *)(*(long *)(local_8 + 0x427a8) + 0xc0) & 8) != 0) && (uVar1 < uVar2)) {
    for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
      auStack_58[local_b4] = *(undefined4 *)((long)auStack_c8 + (long)local_b4 * 4);
      auStack_48[local_b4] = auStack_c8[(long)local_b4 + -4];
      auStack_28[local_b4] = auStack_108[local_b4];
    }
  }
  local_b0 = 3;
  aom_codec_pkt_list_add(in_stack_fffffffffffffe98,(aom_codec_cx_pkt *)0x21daca);
  return;
}

Assistant:

static void generate_psnr_packet(AV1_COMP *cpi) {
  struct aom_codec_cx_pkt pkt;
  int i;
  PSNR_STATS psnr;
#if CONFIG_AV1_HIGHBITDEPTH
  const uint32_t in_bit_depth = cpi->oxcf.input_cfg.input_bit_depth;
  const uint32_t bit_depth = cpi->td.mb.e_mbd.bd;
  aom_calc_highbd_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr,
                       bit_depth, in_bit_depth);
#else
  aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
#endif

  for (i = 0; i < 4; ++i) {
    pkt.data.psnr.samples[i] = psnr.samples[i];
    pkt.data.psnr.sse[i] = psnr.sse[i];
    pkt.data.psnr.psnr[i] = psnr.psnr[i];
  }

#if CONFIG_AV1_HIGHBITDEPTH
  if ((cpi->source->flags & YV12_FLAG_HIGHBITDEPTH) &&
      (in_bit_depth < bit_depth)) {
    for (i = 0; i < 4; ++i) {
      pkt.data.psnr.samples_hbd[i] = psnr.samples_hbd[i];
      pkt.data.psnr.sse_hbd[i] = psnr.sse_hbd[i];
      pkt.data.psnr.psnr_hbd[i] = psnr.psnr_hbd[i];
    }
  }
#endif

  pkt.kind = AOM_CODEC_PSNR_PKT;
  aom_codec_pkt_list_add(cpi->ppi->output_pkt_list, &pkt);
}